

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemAddFlags flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiNavLayer IVar7;
  uint uVar8;
  ImGuiWindow *window;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  ImGui *this;
  undefined4 in_register_00000034;
  ImGuiNavItemData *result;
  ImGuiContext *g;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar11 = GImGui;
  result = (ImGuiNavItemData *)CONCAT44(in_register_00000034,id);
  window = GImGui->CurrentWindow;
  if (id == 0) goto LAB_0014d72f;
  IVar7 = (window->DC).NavLayerCurrent;
  psVar1 = &(window->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar7 & 0x1f));
  if ((((pIVar11->NavId != id) && (pIVar11->NavAnyRequest != true)) ||
      (pIVar9 = pIVar11->NavWindow, pIVar9->RootWindowForNav != window->RootWindowForNav)) ||
     ((window != pIVar9 && (((uint)(pIVar9->Flags | window->Flags) >> 0x17 & 1) == 0))))
  goto LAB_0014d72f;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar8 = pIVar11->CurrentItemFlags;
  fVar20 = (window->Pos).x;
  fVar15 = (window->Pos).y;
  fVar19 = (nav_bb_arg->Min).x - fVar20;
  fVar14 = (nav_bb_arg->Min).y - fVar15;
  fVar20 = (nav_bb_arg->Max).x - fVar20;
  fVar15 = (nav_bb_arg->Max).y - fVar15;
  if ((pIVar11->NavInitRequest == true) && (pIVar11->NavLayer == IVar7)) {
    if (((uVar8 & 0x10) == 0) || (pIVar11->NavInitResultId == 0)) {
      pIVar11->NavInitResultId = id;
      IVar16.y = fVar14;
      IVar16.x = fVar19;
      IVar10.y = fVar15;
      IVar10.x = fVar20;
      (pIVar11->NavInitResultRectRel).Min = IVar16;
      (pIVar11->NavInitResultRectRel).Max = IVar10;
    }
    if ((uVar8 & 0x10) == 0) {
      pIVar11->NavInitRequest = false;
      if (pIVar11->NavMoveRequest == false) {
        pIVar11->NavAnyRequest = false;
      }
      else {
        pIVar11->NavAnyRequest = true;
        if (pIVar11->NavWindow == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                        ,0x22e7,"void ImGui::NavUpdateAnyRequestFlag()");
        }
      }
    }
  }
  if (pIVar11->NavId == id) {
    if (((byte)pIVar11->NavMoveRequestFlags >> 4 & (uVar8 & 0xc) == 0) != 0) {
LAB_0014d8b3:
      this = (ImGui *)&pIVar11->NavMoveResultOther;
      if (pIVar11->NavWindow == window) {
        this = (ImGui *)&pIVar11->NavMoveResultLocal;
      }
      if ((pIVar11->NavMoveRequest == true) &&
         (bVar12 = NavScoreItem(this,result,*nav_bb_arg), bVar12)) {
        *(ImGuiWindow **)this = window;
        *(ImGuiID *)(this + 8) = id;
        *(ImGuiID *)(this + 0xc) = (window->DC).NavFocusScopeIdCurrent;
        *(float *)(this + 0x10) = fVar19;
        *(float *)(this + 0x14) = fVar14;
        *(float *)(this + 0x18) = fVar20;
        *(float *)(this + 0x1c) = fVar15;
      }
      if ((pIVar11->NavMoveRequestFlags & 0x20) != 0) {
        fVar4 = (nav_bb_arg->Min).y;
        fVar17 = (window->ClipRect).Max.y;
        if (fVar4 < fVar17) {
          fVar5 = (nav_bb_arg->Max).y;
          fVar6 = (window->ClipRect).Min.y;
          if (((fVar6 < fVar5) &&
              (fVar18 = (window->ClipRect).Max.x,
              (nav_bb_arg->Min).x <= fVar18 && fVar18 != (nav_bb_arg->Min).x)) &&
             (fVar18 = (nav_bb_arg->Max).x,
             (window->ClipRect).Min.x <= fVar18 && fVar18 != (window->ClipRect).Min.x)) {
            fVar18 = fVar17;
            if (fVar5 <= fVar17) {
              fVar18 = fVar5;
            }
            if (fVar4 <= fVar17) {
              fVar17 = fVar4;
            }
            if (((fVar5 - fVar4) * 0.7 <=
                 (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 |
                        ~-(uint)(fVar5 < fVar6) & (uint)fVar18) -
                 (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 |
                        ~-(uint)(fVar4 < fVar6) & (uint)fVar17)) &&
               (bVar12 = NavScoreItem((ImGui *)&pIVar11->NavMoveResultLocalVisibleSet,result,
                                      *nav_bb_arg), bVar12)) {
              (pIVar11->NavMoveResultLocalVisibleSet).Window = window;
              (pIVar11->NavMoveResultLocalVisibleSet).ID = id;
              (pIVar11->NavMoveResultLocalVisibleSet).FocusScopeId =
                   (window->DC).NavFocusScopeIdCurrent;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar19;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar14;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar20;
              (pIVar11->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar15;
            }
          }
        }
      }
    }
  }
  else if ((uVar8 & 0xc) == 0) goto LAB_0014d8b3;
  if (pIVar11->NavId == id) {
    pIVar11->NavWindow = window;
    IVar7 = (window->DC).NavLayerCurrent;
    pIVar11->NavLayer = IVar7;
    pIVar11->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
    pIVar11->NavIdIsAlive = true;
    pIVar3 = window->NavRectRel + IVar7;
    (pIVar3->Min).x = fVar19;
    (pIVar3->Min).y = fVar14;
    (pIVar3->Max).x = fVar20;
    (pIVar3->Max).y = fVar15;
  }
LAB_0014d72f:
  (window->DC).LastItemId = id;
  IVar10 = bb->Max;
  (window->DC).LastItemRect.Min = bb->Min;
  (window->DC).LastItemRect.Max = IVar10;
  (window->DC).LastItemStatusFlags = 0;
  (pIVar11->NextItemData).Flags = 0;
  bVar12 = IsClippedEx(bb,id,false);
  if (!bVar12) {
    if ((flags & 1U) != 0) {
      ItemFocusable(window,id);
    }
    bVar13 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar13) {
      pIVar2 = &(window->DC).LastItemStatusFlags;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
    }
  }
  return !bVar12;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemAddFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    // Equivalent to calling SetLastItemData()
    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // Tab stop handling (previously was using internal ItemFocusable() api)
    // FIXME-NAV: We would now want to move this above the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (flags & ImGuiItemAddFlags_Focusable)
        ItemFocusable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}